

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void solve_l2r_l1l2_svr(problem *prob,double *w,parameter *param,int solver_type)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  feature_node **ppfVar7;
  feature_node *pfVar8;
  feature_node *pfVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  void *__s;
  void *pvVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double local_d8;
  double local_d0;
  double local_c8;
  
  iVar2 = prob->l;
  uVar21 = (ulong)iVar2;
  dVar24 = param->eps;
  dVar29 = param->C;
  dVar1 = param->p;
  uVar16 = prob->n;
  uVar18 = uVar21 * 4;
  if ((long)uVar21 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  uVar17 = 0xffffffffffffffff;
  if ((long)uVar21 >= 0) {
    uVar17 = uVar21 * 8;
  }
  pvVar12 = operator_new__(uVar18);
  __s = operator_new__(uVar17);
  pvVar13 = operator_new__(uVar17);
  dVar23 = 0.0;
  if (solver_type != 0xd) {
    dVar23 = 0.5 / dVar29;
    dVar29 = INFINITY;
  }
  pdVar6 = prob->y;
  if (0 < (long)uVar21) {
    memset(__s,0,uVar21 * 8);
  }
  if (0 < (int)uVar16) {
    memset(w,0,(ulong)uVar16 * 8);
  }
  if (0 < iVar2) {
    ppfVar7 = prob->x;
    uVar18 = 0;
    do {
      *(undefined8 *)((long)pvVar13 + uVar18 * 8) = 0;
      iVar11 = ppfVar7[uVar18]->index;
      if (iVar11 != -1) {
        dVar32 = *(double *)((long)__s + uVar18 * 8);
        dVar25 = 0.0;
        pfVar8 = ppfVar7[uVar18];
        do {
          dVar27 = pfVar8->value;
          dVar25 = dVar25 + dVar27 * dVar27;
          *(double *)((long)pvVar13 + uVar18 * 8) = dVar25;
          w[(long)iVar11 + -1] = dVar27 * dVar32 + w[(long)iVar11 + -1];
          iVar11 = pfVar8[1].index;
          pfVar8 = pfVar8 + 1;
        } while (iVar11 != -1);
      }
      *(int *)((long)pvVar12 + uVar18 * 4) = (int)uVar18;
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar21);
  }
  dVar25 = -dVar29;
  local_c8 = INFINITY;
  uVar18 = uVar21;
  dVar32 = -1.0;
  uVar10 = 0;
  do {
    uVar17 = uVar18 & 0xffffffff;
    if ((int)uVar18 < 1) {
      local_d8 = 0.0;
      local_d0 = 0.0;
      uVar18 = uVar17;
    }
    else {
      uVar19 = uVar18 & 0xffffffff;
      uVar22 = 0;
      do {
        iVar11 = rand();
        lVar14 = (long)(iVar11 % (int)uVar19) + uVar22;
        uVar3 = *(undefined4 *)((long)pvVar12 + uVar22 * 4);
        *(undefined4 *)((long)pvVar12 + uVar22 * 4) = *(undefined4 *)((long)pvVar12 + lVar14 * 4);
        *(undefined4 *)((long)pvVar12 + lVar14 * 4) = uVar3;
        uVar22 = uVar22 + 1;
        uVar19 = (ulong)((int)uVar19 - 1);
      } while (uVar17 != uVar22);
      if ((int)uVar18 < 1) {
        local_d8 = 0.0;
        local_d0 = 0.0;
        uVar18 = uVar17;
      }
      else {
        ppfVar7 = prob->x;
        local_d0 = 0.0;
        iVar11 = 0;
        local_d8 = 0.0;
        do {
          iVar4 = *(int *)((long)pvVar12 + (long)iVar11 * 4);
          lVar14 = (long)iVar4;
          dVar27 = *(double *)((long)__s + lVar14 * 8);
          dVar28 = dVar23 * dVar27 - pdVar6[lVar14];
          pfVar8 = ppfVar7[lVar14];
          iVar5 = pfVar8->index;
          pfVar9 = pfVar8;
          iVar20 = iVar5;
          while (iVar20 != -1) {
            dVar28 = dVar28 + pfVar9->value * w[(long)iVar20 + -1];
            iVar20 = pfVar9[1].index;
            pfVar9 = pfVar9 + 1;
          }
          dVar30 = *(double *)((long)pvVar13 + lVar14 * 8) + dVar23;
          dVar26 = dVar1 + dVar28;
          dVar28 = dVar28 - dVar1;
          if ((dVar27 != 0.0) || (NAN(dVar27))) {
            if (dVar27 < dVar29) {
              if (dVar27 <= dVar25) {
                dVar31 = dVar28;
                if (dVar28 < 0.0) goto LAB_0010a9f5;
                dVar31 = 0.0;
                if (local_c8 < dVar28) goto LAB_0010ab35;
              }
              else {
                dVar31 = dVar28;
                if (0.0 < dVar27) {
                  dVar31 = dVar26;
                }
                dVar31 = ABS(dVar31);
              }
            }
            else {
              dVar31 = dVar26;
              if ((dVar26 <= 0.0) && (dVar31 = 0.0, dVar26 < -local_c8)) goto LAB_0010ab35;
            }
LAB_0010aa6e:
            if (dVar27 * dVar30 <= dVar26) {
              if (dVar28 <= dVar27 * dVar30) {
                dVar30 = -dVar27;
              }
              else {
                dVar30 = -dVar28 / dVar30;
              }
            }
            else {
              dVar30 = -dVar26 / dVar30;
            }
            if (local_d0 <= dVar31) {
              local_d0 = dVar31;
            }
            local_d8 = local_d8 + dVar31;
            if (1e-12 <= ABS(dVar30)) {
              dVar28 = dVar30 + dVar27;
              if (dVar30 + dVar27 <= dVar25) {
                dVar28 = dVar25;
              }
              if (dVar29 <= dVar28) {
                dVar28 = dVar29;
              }
              *(double *)((long)__s + lVar14 * 8) = dVar28;
              dVar28 = dVar28 - dVar27;
              if ((dVar28 != 0.0) || (NAN(dVar28))) {
                while (iVar5 != -1) {
                  w[(long)iVar5 + -1] = pfVar8->value * dVar28 + w[(long)iVar5 + -1];
                  iVar5 = pfVar8[1].index;
                  pfVar8 = pfVar8 + 1;
                }
              }
            }
          }
          else {
            dVar31 = dVar26;
            if (dVar26 < 0.0) {
LAB_0010a9f5:
              dVar31 = -dVar31;
              goto LAB_0010aa6e;
            }
            dVar31 = dVar28;
            if (((0.0 < dVar28) || (dVar31 = 0.0, dVar26 <= local_c8)) || (-local_c8 <= dVar28))
            goto LAB_0010aa6e;
LAB_0010ab35:
            iVar20 = (int)uVar18;
            uVar18 = (ulong)(iVar20 - 1);
            *(undefined4 *)((long)pvVar12 + (long)iVar11 * 4) =
                 *(undefined4 *)((long)pvVar12 + (long)iVar20 * 4 + -4);
            *(int *)((long)pvVar12 + (long)iVar20 * 4 + -4) = iVar4;
            iVar11 = iVar11 + -1;
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < (int)uVar18);
      }
    }
    dVar27 = local_d8;
    if (uVar10 != 0) {
      dVar27 = dVar32;
    }
    uVar15 = uVar10 + 1;
    if ((uVar15 * -0x33333333 >> 1 | (uint)((uVar15 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)
    {
      info(".");
    }
    if (local_d8 <= dVar24 * dVar27) {
      if ((int)uVar18 == iVar2) {
        info("\noptimization finished, #iter = %d\n",(ulong)uVar15);
        if (uVar10 == 999) goto LAB_0010ac72;
        goto LAB_0010ac80;
      }
      info("*");
      local_d0 = INFINITY;
      uVar18 = uVar21;
    }
    dVar32 = dVar27;
    local_c8 = local_d0;
    uVar10 = uVar15;
  } while (uVar15 != 1000);
  info("\noptimization finished, #iter = %d\n",1000);
LAB_0010ac72:
  info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");
LAB_0010ac80:
  dVar24 = 0.0;
  if (0 < (int)uVar16) {
    uVar18 = 0;
    do {
      dVar24 = dVar24 + w[uVar18] * w[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar16 != uVar18);
    dVar24 = dVar24 * 0.5;
  }
  if (iVar2 < 1) {
    uVar16 = 0;
  }
  else {
    uVar18 = 0;
    uVar16 = 0;
    do {
      dVar29 = *(double *)((long)__s + uVar18 * 8);
      dVar24 = dVar24 + dVar23 * 0.5 * dVar29 * dVar29 +
                        (ABS(dVar29) * dVar1 - pdVar6[uVar18] * dVar29);
      uVar16 = uVar16 + (dVar29 != 0.0);
      uVar18 = uVar18 + 1;
    } while (uVar21 != uVar18);
  }
  info("Objective value = %lf\n",dVar24);
  info("nSV = %d\n",(ulong)uVar16);
  operator_delete__(__s);
  operator_delete__(pvVar13);
  operator_delete__(pvVar12);
  return;
}

Assistant:

static void solve_l2r_l1l2_svr(
	const problem *prob, double *w, const parameter *param,
	int solver_type)
{
	int l = prob->l;
	double C = param->C;
	double p = param->p;
	int w_size = prob->n;
	double eps = param->eps;
	int i, s, iter = 0;
	int max_iter = 1000;
	int active_size = l;
	int *index = new int[l];

	double d, G, H;
	double Gmax_old = INF;
	double Gmax_new, Gnorm1_new;
	double Gnorm1_init = -1.0; // Gnorm1_init is initialized at the first iteration
	double *beta = new double[l];
	double *QD = new double[l];
	double *y = prob->y;

	// L2R_L2LOSS_SVR_DUAL
	double lambda[1], upper_bound[1];
	lambda[0] = 0.5/C;
	upper_bound[0] = INF;

	if(solver_type == L2R_L1LOSS_SVR_DUAL)
	{
		lambda[0] = 0;
		upper_bound[0] = C;
	}

	// Initial beta can be set here. Note that
	// -upper_bound <= beta[i] <= upper_bound
	for(i=0; i<l; i++)
		beta[i] = 0;

	for(i=0; i<w_size; i++)
		w[i] = 0;
	for(i=0; i<l; i++)
	{
		QD[i] = 0;
		feature_node *xi = prob->x[i];
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;
			w[xi->index-1] += beta[i]*val;
			xi++;
		}

		index[i] = i;
	}


	while(iter < max_iter)
	{
		Gmax_new = 0;
		Gnorm1_new = 0;

		for(i=0; i<active_size; i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}

		for(s=0; s<active_size; s++)
		{
			i = index[s];
			G = -y[i] + lambda[GETI(i)]*beta[i];
			H = QD[i] + lambda[GETI(i)];

			feature_node *xi = prob->x[i];
			while(xi->index != -1)
			{
				int ind = xi->index-1;
				double val = xi->value;
				G += val*w[ind];
				xi++;
			}

			double Gp = G+p;
			double Gn = G-p;
			double violation = 0;
			if(beta[i] == 0)
			{
				if(Gp < 0)
					violation = -Gp;
				else if(Gn > 0)
					violation = Gn;
				else if(Gp>Gmax_old && Gn<-Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] >= upper_bound[GETI(i)])
			{
				if(Gp > 0)
					violation = Gp;
				else if(Gp < -Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] <= -upper_bound[GETI(i)])
			{
				if(Gn < 0)
					violation = -Gn;
				else if(Gn > Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] > 0)
				violation = fabs(Gp);
			else
				violation = fabs(Gn);

			Gmax_new = max(Gmax_new, violation);
			Gnorm1_new += violation;

			// obtain Newton direction d
			if(Gp < H*beta[i])
				d = -Gp/H;
			else if(Gn > H*beta[i])
				d = -Gn/H;
			else
				d = -beta[i];

			if(fabs(d) < 1.0e-12)
				continue;

			double beta_old = beta[i];
			beta[i] = min(max(beta[i]+d, -upper_bound[GETI(i)]), upper_bound[GETI(i)]);
			d = beta[i]-beta_old;

			if(d != 0)
			{
				xi = prob->x[i];
				while(xi->index != -1)
				{
					w[xi->index-1] += d*xi->value;
					xi++;
				}
			}
		}

		if(iter == 0)
			Gnorm1_init = Gnorm1_new;
		iter++;
		if(iter % 10 == 0)
			info(".");

		if(Gnorm1_new <= eps*Gnorm1_init)
		{
			if(active_size == l)
				break;
			else
			{
				active_size = l;
				info("*");
				Gmax_old = INF;
				continue;
			}
		}

		Gmax_old = Gmax_new;
	}

	info("\noptimization finished, #iter = %d\n", iter);
	if(iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0; i<w_size; i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0; i<l; i++)
	{
		v += p*fabs(beta[i]) - y[i]*beta[i] + 0.5*lambda[GETI(i)]*beta[i]*beta[i];
		if(beta[i] != 0)
			nSV++;
	}

	info("Objective value = %lf\n", v);
	info("nSV = %d\n",nSV);

	delete [] beta;
	delete [] QD;
	delete [] index;
}